

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O3

void crnlib::image_utils::renorm_normal_map(image_u8 *img)

{
  byte bVar1;
  color_quad<unsigned_char,_int> cVar2;
  color_quad<unsigned_char,_int> *pcVar3;
  uint i;
  uint uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong extraout_RDX;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  byte bVar13;
  float fVar11;
  float fVar12;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  char cVar16;
  byte bVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  byte bVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  float local_68 [3];
  uint local_5c;
  float local_58 [4];
  char local_48;
  char cStack_47;
  byte bStack_46;
  byte bStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  
  uVar10 = img->m_height;
  if (uVar10 != 0) {
    uVar4 = img->m_width;
    cVar16 = -0x80;
    bVar17 = 0x80;
    cVar19 = '\0';
    cVar20 = '\0';
    cVar22 = '\0';
    cVar23 = '\0';
    cVar25 = '\0';
    cVar26 = '\0';
    uVar7 = (ulong)uVar4;
    uVar8 = 0;
    local_48 = -0x80;
    cStack_47 = -0x80;
    bStack_46 = 0x80;
    bStack_45 = 0x80;
    cStack_44 = '\0';
    cStack_43 = '\0';
    cStack_42 = '\0';
    cStack_41 = '\0';
    cStack_40 = '\0';
    cStack_3f = '\0';
    cStack_3e = '\0';
    cStack_3d = '\0';
    cStack_3c = '\0';
    cStack_3b = '\0';
    cStack_3a = '\0';
    cStack_39 = '\0';
    cVar18 = cVar16;
    bVar21 = bVar17;
    cVar24 = cVar19;
    cVar27 = cVar20;
    cVar28 = cVar22;
    cVar29 = cVar23;
    cVar30 = cVar25;
    cVar31 = cVar26;
    do {
      if ((int)uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        uVar10 = 0;
        local_5c = uVar8;
        do {
          pcVar3 = img->m_pPixels;
          uVar9 = img->m_pitch * uVar8 + uVar10;
          cVar2.field_0 =
               (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
               *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                &pcVar3[uVar9].field_0.field_0;
          bVar13 = cVar2.field_0._1_1_;
          auVar14[0] = -(cVar2.field_0._0_1_ == cVar16);
          auVar14[1] = -(cVar2.field_0._0_1_ == cVar18);
          auVar14[2] = -(bVar13 == bVar17);
          auVar14[3] = -(bVar13 == bVar21);
          auVar14[4] = -(cVar2.field_0._2_1_ == cVar19);
          auVar14[5] = -(cVar2.field_0._2_1_ == cVar24);
          auVar14[6] = -(cVar2.field_0._3_1_ == cVar20);
          auVar14[7] = -(cVar2.field_0._3_1_ == cVar27);
          auVar14[8] = -(cVar22 == '\0');
          auVar14[9] = -(cVar28 == '\0');
          auVar14[10] = -(cVar23 == '\0');
          auVar14[0xb] = -(cVar29 == '\0');
          auVar14[0xc] = -(cVar25 == '\0');
          auVar14[0xd] = -(cVar30 == '\0');
          auVar14[0xe] = -(cVar26 == '\0');
          auVar14[0xf] = -(cVar31 == '\0');
          auVar14 = pshuflw(auVar14,auVar14,0x50);
          auVar15._0_4_ = auVar14._0_4_;
          auVar15._4_4_ = auVar15._0_4_;
          auVar15._8_4_ = auVar14._4_4_;
          auVar15._12_4_ = auVar14._4_4_;
          uVar6 = movmskpd((int)uVar7,auVar15);
          uVar7 = (ulong)uVar6 ^ 3;
          bVar1 = pcVar3[uVar9].field_0.field_0.b;
          if (bVar1 != 0x80 || (char)uVar7 != '\0') {
            local_68[0] = (float)((uint)cVar2.field_0 & 0xff);
            local_68[1] = (float)bVar13;
            local_68[2] = (float)bVar1;
            lVar5 = 0;
            do {
              local_68[lVar5] = local_68[lVar5] * 0.003921569;
              lVar5 = lVar5 + 1;
            } while (lVar5 != 3);
            lVar5 = 0;
            do {
              local_68[lVar5] = local_68[lVar5] + local_68[lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar5 != 3);
            local_58[0] = 1.0;
            local_58[1] = 1.0;
            local_58[2] = 1.0;
            lVar5 = 0;
            do {
              local_68[lVar5] = local_68[lVar5] - local_58[lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar5 != 3);
            lVar5 = 0;
            do {
              fVar11 = local_68[lVar5];
              fVar12 = 1.0;
              if (fVar11 <= 1.0) {
                fVar12 = fVar11;
              }
              local_68[lVar5] =
                   (float)(-(uint)(fVar11 < -1.0) & 0xbf800000 |
                          ~-(uint)(fVar11 < -1.0) & (uint)fVar12);
              lVar5 = lVar5 + 1;
            } while (lVar5 != 3);
            fVar11 = SQRT(local_68[2] * local_68[2] +
                          local_68[0] * local_68[0] + local_68[1] * local_68[1]);
            if (0.077 <= fVar11) {
              if (0.077 < ABS(fVar11 + -1.0)) {
                lVar5 = 0;
                do {
                  local_68[lVar5] = local_68[lVar5] / fVar11;
                  lVar5 = lVar5 + 1;
                } while (lVar5 != 3);
                lVar5 = 0;
                do {
                  fVar12 = floorf((local_68[lVar5] + 1.0) * 0.5 * 255.0 + 0.5);
                  fVar11 = 255.0;
                  if (fVar12 <= 255.0) {
                    fVar11 = fVar12;
                  }
                  pcVar3[uVar9].field_0.c[lVar5] =
                       (uchar)(int)(float)(~-(uint)(fVar12 < 0.0) & (uint)fVar11);
                  lVar5 = lVar5 + 1;
                  uVar7 = extraout_RDX;
                  uVar8 = local_5c;
                  cVar16 = local_48;
                  cVar18 = cStack_47;
                  bVar17 = bStack_46;
                  bVar21 = bStack_45;
                  cVar19 = cStack_44;
                  cVar24 = cStack_43;
                  cVar20 = cStack_42;
                  cVar27 = cStack_41;
                  cVar22 = cStack_40;
                  cVar28 = cStack_3f;
                  cVar23 = cStack_3e;
                  cVar29 = cStack_3d;
                  cVar25 = cStack_3c;
                  cVar30 = cStack_3b;
                  cVar26 = cStack_3a;
                  cVar31 = cStack_39;
                } while (lVar5 != 3);
              }
            }
            else {
              *(undefined2 *)&pcVar3[uVar9].field_0 = 0x8080;
              pcVar3[uVar9].field_0.field_0.b = 0x80;
            }
            uVar4 = img->m_width;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar4);
        uVar10 = img->m_height;
        uVar7 = (ulong)uVar4;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar10);
  }
  return;
}

Assistant:

inline uint get_width() const { return m_width; }